

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O3

Publication * __thiscall
helics::ValueFederateManager::getPublication(ValueFederateManager *this,string_view key)

{
  int iVar1;
  Publication **ppPVar2;
  Publication *pPVar3;
  BlockIterator<const_helics::Publication,_32,_const_helics::Publication_*const_*> pubF;
  shared_handle pubHandle;
  BlockIterator<const_helics::Publication,_32,_const_helics::Publication_*const_*> local_48;
  shared_handle local_30;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::lock_shared(&local_30,&this->publications);
  gmlc::containers::
  DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>::
  find(&local_48,local_30.data,key);
  iVar1 = ((local_30.data)->dataStorage).bsize;
  ppPVar2 = ((local_30.data)->dataStorage).dataptr;
  if (iVar1 == 0x20) {
    if (ppPVar2 == (Publication **)0x0) {
      ppPVar2 = (Publication **)
                &gmlc::containers::
                 StableBlockVector<helics::Publication,5u,std::allocator<helics::Publication>>::
                 end()::emptyValue;
    }
    else {
      ppPVar2 = ppPVar2 + (long)((local_30.data)->dataStorage).dataSlotIndex + 1;
    }
    iVar1 = 0;
  }
  else {
    ppPVar2 = ppPVar2 + ((local_30.data)->dataStorage).dataSlotIndex;
  }
  pPVar3 = (Publication *)invalidPub;
  if (local_48.vec != ppPVar2) {
    pPVar3 = local_48.ptr;
  }
  if (local_48.offset != iVar1) {
    pPVar3 = local_48.ptr;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30.m_handle_lock);
  return pPVar3;
}

Assistant:

const Publication& ValueFederateManager::getPublication(std::string_view key) const
{
    auto pubHandle = publications.lock_shared();
    auto pubF = pubHandle->find(key);
    if (pubF != pubHandle->end()) {
        return *pubF;
    }
    return invalidPub;
}